

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoSimdShift<int,int>(Thread *this,BinopFunc<int,_int> *f)

{
  int iVar1;
  u8 i;
  long lVar2;
  Value VVar3;
  SR result;
  Simd<int,_(unsigned_char)__x04_> lhs;
  Value local_40;
  Value local_30;
  
  VVar3 = Pop(this);
  local_30 = Pop(this);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    iVar1 = (*f)(*(int *)((long)&local_30 + lVar2 * 4),VVar3.i32_);
    *(int *)((long)&local_40 + lVar2 * 4) = iVar1;
  }
  Push(this,local_40);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<T>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}